

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void alloc_hist_array(void)

{
  message *__ptr;
  int iVar1;
  int iVar2;
  int local_20;
  int pos;
  int oldpos;
  int oldsize;
  int i;
  message *oldhistory;
  
  iVar2 = histpos;
  iVar1 = histsize;
  __ptr = msghistory;
  msghistory = (message *)calloc((long)settings.msghistory,0x10);
  histsize = settings.msghistory;
  histpos = -1;
  for (oldpos = 0; oldpos < histsize; oldpos = oldpos + 1) {
    msghistory[oldpos].turn = 0;
    msghistory[oldpos].msg = (char *)0x0;
  }
  if (__ptr != (message *)0x0) {
    for (oldpos = 0; oldpos < iVar1; oldpos = oldpos + 1) {
      local_20 = iVar2 + oldpos + 1;
      if (iVar1 <= local_20) {
        local_20 = local_20 - iVar1;
      }
      if (__ptr[local_20].turn != 0) {
        store_message(__ptr[local_20].turn,__ptr[local_20].msg);
      }
      if (__ptr[local_20].msg != (char *)0x0) {
        free(__ptr[local_20].msg);
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

void alloc_hist_array(void)
{
    struct message *oldhistory = msghistory;
    int i, oldsize = histsize, oldpos = histpos;
    
    msghistory = calloc(settings.msghistory, sizeof(struct message));
    histsize = settings.msghistory;
    histpos = -1; /* histpos is incremented before any message is stored */
    for (i = 0; i < histsize; i++) {
	msghistory[i].turn = 0;
	msghistory[i].msg = NULL;
    }

    if (!oldhistory)
	return;
    
    for (i = 0; i < oldsize; i++) {
	int pos = oldpos + i + 1;
	if (pos >= oldsize) /* wrap around eventually */
	    pos -= oldsize;
	
	if (oldhistory[pos].turn)
	    store_message(oldhistory[pos].turn, oldhistory[pos].msg);
	if (oldhistory[pos].msg)
	    free(oldhistory[pos].msg);
    }
    
    free(oldhistory);
}